

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O1

int dwarf_prologue_end_etc
              (Dwarf_Line line,Dwarf_Bool *prologue_end,Dwarf_Bool *epilogue_begin,
              Dwarf_Unsigned *isa,Dwarf_Unsigned *discriminator,Dwarf_Error *error)

{
  if (line != (Dwarf_Line)0x0) {
    *prologue_end = *(uint *)&(line->li_l_data).field_0x30 >> 3 & 1;
    *epilogue_begin = *(uint *)&(line->li_l_data).field_0x30 >> 4 & 1;
    *isa = (ulong)(line->li_l_data).li_isa;
    *discriminator = (line->li_l_data).li_discriminator;
    return 0;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,0x3b);
  return 1;
}

Assistant:

int
dwarf_prologue_end_etc(Dwarf_Line  line,
    Dwarf_Bool  *    prologue_end,
    Dwarf_Bool  *    epilogue_begin,
    Dwarf_Unsigned * isa,
    Dwarf_Unsigned * discriminator,
    Dwarf_Error *    error)
{
    if (line == NULL) {
        _dwarf_error(NULL, error, DW_DLE_DWARF_LINE_NULL);
        return DW_DLV_ERROR;
    }
    *prologue_end = line->li_l_data.li_prologue_end;
    *epilogue_begin =
        line->li_l_data.li_epilogue_begin;
    *isa = line->li_l_data.li_isa;
    *discriminator = line->li_l_data.li_discriminator;
    return DW_DLV_OK;
}